

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O3

void gcm_mult(mbedtls_gcm_context *ctx,uchar *x,uchar *output)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (ctx->acceleration != '\0') {
    return;
  }
  uVar2 = (ulong)((x[0xf] & 0xf) << 4);
  uVar1 = *(ulong *)((long)ctx->H[0] + uVar2);
  uVar2 = *(ulong *)((long)ctx->H[0] + uVar2 + 8);
  uVar5 = (ulong)(x[0xf] & 0xfffffff0);
  uVar4 = (ulong)last4[(uint)uVar2 & 0xf] << 0x30 ^ uVar1 >> 4 ^ *(ulong *)((long)ctx->H[0] + uVar5)
  ;
  uVar1 = (uVar2 >> 4 | uVar1 << 0x3c) ^ *(ulong *)((long)ctx->H[0] + uVar5 + 8);
  lVar3 = 0xf;
  do {
    uVar5 = (ulong)((x[lVar3 + -1] & 0xf) << 4);
    uVar2 = (ulong)last4[(uint)uVar1 & 0xf] << 0x30 ^ uVar4 >> 4 ^
            *(ulong *)((long)ctx->H[0] + uVar5);
    uVar1 = (uVar1 >> 4 | uVar4 << 0x3c) ^ *(ulong *)((long)ctx->H[0] + uVar5 + 8);
    uVar5 = (ulong)(x[lVar3 + -1] & 0xfffffff0);
    uVar4 = (ulong)last4[(uint)uVar1 & 0xf] << 0x30 ^ uVar2 >> 4 ^
            *(ulong *)((long)ctx->H[0] + uVar5);
    uVar1 = (uVar1 >> 4 | uVar2 << 0x3c) ^ *(ulong *)((long)ctx->H[0] + uVar5 + 8);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  *(ulong *)output =
       uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
       (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  *(ulong *)(output + 8) =
       uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
       (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
       (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  return;
}

Assistant:

static void gcm_mult(mbedtls_gcm_context *ctx, const unsigned char x[16],
                     unsigned char output[16])
{
    switch (ctx->acceleration) {
#if defined(MBEDTLS_AESNI_HAVE_CODE)
        case MBEDTLS_GCM_ACC_AESNI:
            mbedtls_aesni_gcm_mult(output, x, (uint8_t *) ctx->H[MBEDTLS_GCM_HTABLE_SIZE/2]);
            break;
#endif

#if defined(MBEDTLS_AESCE_HAVE_CODE)
        case MBEDTLS_GCM_ACC_AESCE:
            mbedtls_aesce_gcm_mult(output, x, (uint8_t *) ctx->H[MBEDTLS_GCM_HTABLE_SIZE/2]);
            break;
#endif

#if defined(MBEDTLS_GCM_LARGE_TABLE)
        case MBEDTLS_GCM_ACC_LARGETABLE:
            gcm_mult_largetable(output, x, ctx->H);
            break;
#else
        case MBEDTLS_GCM_ACC_SMALLTABLE:
            gcm_mult_smalltable(output, x, ctx->H);
            break;
#endif
    }

    return;
}